

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O3

void spell_freezemetal(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  OBJ_DATA *obj;
  long lVar4;
  int idam;
  int idam_00;
  uint iWear;
  
  idam = 0;
  act("The air around you suddenly turns ice cold.",ch,(void *)0x0,vo,2);
  act("You attempt to siphon heat away from $N\'s armor.",ch,(void *)0x0,vo,3);
  act("$n extends a hand toward $N, as a chill fills the air.",ch,(void *)0x0,vo,1);
  idam_00 = 0;
  iWear = 0;
  do {
    obj = get_eq_char((CHAR_DATA *)vo,iWear);
    if (((iWear & 0x1d) != 0x10 && obj != (OBJ_DATA *)0x0) &&
       (bVar1 = is_obj_stat(obj,0x18), !bVar1)) {
      lVar4 = (long)obj->pIndexData->material_index;
      if (lVar4 < 1) {
        iVar3 = 0;
      }
      else {
        iVar3 = material_table[lVar4].mat_conductivity * 0x14;
      }
      iVar2 = number_range(0,100);
      if (iVar2 < iVar3) {
        iVar2 = 0;
        act_new("Your $p contracts due to the cold, crushing you painfully!",ch,obj,vo,2,0);
        act("$N\'s $p contracts, crushing him painfully!",ch,obj,vo,3);
        act("$N\'s $p contracts, crushing him painfully!",ch,obj,vo,1);
        iVar3 = dice(level / 10,7);
        lVar4 = (long)obj->pIndexData->material_index;
        if (0 < lVar4) {
          iVar2 = (int)material_table[lVar4].mat_conductivity << 2;
        }
        idam_00 = idam_00 + iVar3;
        iVar3 = number_range(0,100);
        if (iVar3 < iVar2) {
          act_new("Your $p shatters violently, piercing you with countless shards!",ch,obj,vo,2,0);
          act("$N\'s $p shatters violently due to the cold!",ch,obj,vo,3);
          act("$N\'s $p shatters violently due to the cold!",ch,obj,vo,1);
          iVar3 = dice(level / 5,9);
          idam = idam + iVar3;
          extract_obj(obj);
        }
      }
    }
    iWear = iWear + 1;
  } while (iWear != 0x16);
  if (0 < idam_00) {
    damage_new(ch,(CHAR_DATA *)vo,idam_00,sn,1,true,false,0,1,"the contracting armor*");
  }
  if (0 < idam) {
    damage_new(ch,(CHAR_DATA *)vo,idam,sn,2,true,false,0,1,"the metal shards*$");
  }
  return;
}

Assistant:

void spell_freezemetal(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	OBJ_DATA *obj;
	int iWear, highchance, crushdam, piercedam;

	act("The air around you suddenly turns ice cold.", ch, 0, victim, TO_VICT);
	act("You attempt to siphon heat away from $N's armor.", ch, 0, victim, TO_CHAR);
	act("$n extends a hand toward $N, as a chill fills the air.", ch, 0, victim, TO_NOTVICT);

	crushdam = 0;
	piercedam = 0;

	for (iWear = 0; iWear < MAX_WEAR; iWear++)
	{
		obj = get_eq_char(victim, iWear);

		if (obj == nullptr || iWear == WEAR_WIELD || iWear == WEAR_DUAL_WIELD)
			continue;

		if (is_obj_stat(obj, ITEM_BURN_PROOF))
			continue;

		if (obj->pIndexData->material_index > 0)
			highchance = material_table[obj->pIndexData->material_index].mat_conductivity * 20;
		else
			highchance = 0;

		if (number_range(0, 100) >= highchance)
			continue;

		act_new("Your $p contracts due to the cold, crushing you painfully!", ch, obj, victim, TO_VICT, POS_DEAD);
		act("$N's $p contracts, crushing him painfully!", ch, obj, victim, TO_CHAR);
		act("$N's $p contracts, crushing him painfully!", ch, obj, victim, TO_NOTVICT);

		crushdam += dice(level / 10, 7);

		if (obj->pIndexData->material_index > 0)
			highchance = material_table[obj->pIndexData->material_index].mat_conductivity * 4;
		else
			highchance = 0;

		if (number_range(0, 100) >= highchance)
			continue;

		act_new("Your $p shatters violently, piercing you with countless shards!", ch, obj, victim, TO_VICT, POS_DEAD);
		act("$N's $p shatters violently due to the cold!", ch, obj, victim, TO_CHAR);
		act("$N's $p shatters violently due to the cold!", ch, obj, victim, TO_NOTVICT);
		piercedam += dice(level / 5, 9);

		extract_obj(obj);
	}

	if (crushdam > 0)
		damage_new(ch, victim, crushdam, sn, DAM_BASH, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the contracting armor*");

	if (piercedam > 0)
		damage_new(ch, victim, piercedam, sn, DAM_PIERCE, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the metal shards*$");
}